

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O2

void * fs_create_savepoint(char *name,int name_length)

{
  Savepoint *this;
  string local_38;
  
  this = (Savepoint *)operator_new(0x50);
  ser::Savepoint::Savepoint(this);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,name,name + name_length);
  ser::Savepoint::Init(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

void* fs_create_savepoint(const char* name, int name_length)
{
    Savepoint* pSavepoint = new Savepoint;
    pSavepoint->Init(std::string(name, name_length));
    return reinterpret_cast<void*>(pSavepoint);
}